

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syslog_sink.h
# Opt level: O3

void __thiscall
spdlog::sinks::syslog_sink<std::mutex>::sink_it_(syslog_sink<std::mutex> *this,log_msg *msg)

{
  formatter *pfVar1;
  ulong uVar2;
  char *pcVar3;
  string_view_t *psVar4;
  int __pri;
  ulong uVar5;
  string_view_t *psVar6;
  memory_buf_t formatted;
  string_view_t local_148;
  undefined8 local_138;
  code *local_130;
  char local_128 [256];
  
  psVar6 = &local_148;
  local_148.size_ = 0;
  local_130 = ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::grow
  ;
  local_148.data_ = local_128;
  local_138 = 0xfa;
  if (this->enable_formatting_ == true) {
    pfVar1 = (this->super_base_sink<std::mutex>).formatter_._M_t.
             super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
             super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
             super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
    (*pfVar1->_vptr_formatter[2])(pfVar1,msg,&local_148);
    psVar4 = &local_148;
  }
  else {
    psVar6 = &msg->payload;
    psVar4 = &msg->payload;
  }
  uVar2 = psVar4->size_;
  pcVar3 = psVar6->data_;
  __pri = (*(this->super_base_sink<std::mutex>).super_sink._vptr_sink[10])(this,msg);
  uVar5 = 0x7fffffff;
  if (uVar2 < 0x7fffffff) {
    uVar5 = uVar2;
  }
  syslog(__pri,"%.*s",uVar5,pcVar3);
  if (local_148.data_ != local_128) {
    free(local_148.data_);
  }
  return;
}

Assistant:

void sink_it_(const details::log_msg &msg) override {
        string_view_t payload;
        memory_buf_t formatted;
        if (enable_formatting_) {
            base_sink<Mutex>::formatter_->format(msg, formatted);
            payload = string_view_t(formatted.data(), formatted.size());
        } else {
            payload = msg.payload;
        }

        size_t length = payload.size();
        // limit to max int
        if (length > static_cast<size_t>(std::numeric_limits<int>::max())) {
            length = static_cast<size_t>(std::numeric_limits<int>::max());
        }

        ::syslog(syslog_prio_from_level(msg), "%.*s", static_cast<int>(length), payload.data());
    }